

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t __thiscall duckdb::IntToVarInt<short>(duckdb *this,Vector *result,short int_value)

{
  ulong uVar1;
  long lVar2;
  undefined6 in_register_00000012;
  idx_t len;
  idx_t extraout_RDX;
  long lVar3;
  uint uVar4;
  short sVar5;
  char *blob_00;
  double dVar6;
  undefined1 auVar7 [16];
  string_t blob;
  undefined1 local_48 [16];
  ulong local_38;
  
  len = CONCAT62(in_register_00000012,int_value);
  sVar5 = (short)result;
  local_38 = (ulong)result & 0xffff;
  uVar1 = local_38;
  if (sVar5 < 0) {
    uVar1 = -(long)sVar5;
  }
  if (uVar1 == 0) {
    uVar4 = 1;
  }
  else {
    lVar2 = uVar1 + 1;
    auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = 0x45300000;
    dVar6 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    dVar6 = ceil(dVar6 * 0.125);
    uVar4 = (uint)(long)dVar6;
    len = extraout_RDX;
  }
  local_48 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)(uVar4 + 3),len);
  blob_00 = local_48._8_8_;
  if (local_48._0_4_ < 0xd) {
    blob_00 = local_48 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar4,SUB81(local_38 >> 0xf,0));
  if (0 < (int)uVar4) {
    lVar2 = (ulong)uVar4 * 8;
    lVar3 = 3;
    do {
      lVar2 = lVar2 + -8;
      blob_00[lVar3] = (byte)(uVar1 >> ((byte)lVar2 & 0x3f)) ^ (byte)((uint)(int)sVar5 >> 0xf);
      lVar3 = lVar3 + 1;
    } while ((Vector *)(ulong)(uVar4 + 3) != (Vector *)lVar3);
  }
  uVar1 = (ulong)(uint)local_48._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default(local_48 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_48._4_4_ = *(undefined4 *)local_48._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_48;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}